

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::SocketWriter::CloseConnection(SocketWriter *this)

{
  int __fd;
  GTestLog local_c;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "CloseConnection() can be called only when there is a connection.",0x40);
    GTestLog::~GTestLog(&local_c);
    __fd = this->sockfd_;
  }
  close(__fd);
  this->sockfd_ = -1;
  return;
}

Assistant:

void CloseConnection() override {
      GTEST_CHECK_(sockfd_ != -1)
          << "CloseConnection() can be called only when there is a connection.";

      close(sockfd_);
      sockfd_ = -1;
    }